

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsTcpServer.cpp
# Opt level: O3

void __thiscall xs::TcpServer::TcpServer(TcpServer *this,deSocketFamily family,int port)

{
  Socket *this_00;
  int __n;
  SocketAddress address;
  SocketAddress SStack_38;
  
  this->_vptr_TcpServer = (_func_int **)&PTR__TcpServer_0012a950;
  this_00 = &this->m_socket;
  de::Socket::Socket(this_00);
  de::Mutex::Mutex(&this->m_connectionListLock,0);
  (this->m_doneConnections).
  super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_doneConnections).
  super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_liveConnections).
  super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_doneConnections).
  super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_liveConnections).
  super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_liveConnections).
  super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  de::SocketAddress::SocketAddress(&SStack_38);
  de::SocketAddress::setFamily(&SStack_38,family);
  de::SocketAddress::setPort(&SStack_38,port);
  de::SocketAddress::setType(&SStack_38,DE_SOCKETTYPE_STREAM);
  de::SocketAddress::setProtocol(&SStack_38,DE_SOCKETPROTOCOL_TCP);
  de::Socket::listen(this_00,(int)&SStack_38,__n);
  de::Socket::setFlags(this_00,8);
  de::SocketAddress::~SocketAddress(&SStack_38);
  return;
}

Assistant:

TcpServer::TcpServer (deSocketFamily family, int port)
	: m_socket()
{
	de::SocketAddress address;
	address.setFamily(family);
	address.setPort(port);
	address.setType(DE_SOCKETTYPE_STREAM);
	address.setProtocol(DE_SOCKETPROTOCOL_TCP);

	m_socket.listen(address);
	m_socket.setFlags(DE_SOCKET_CLOSE_ON_EXEC);
}